

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::anon_unknown_0::SACSubcaseBase::CheckProgram(SACSubcaseBase *this,GLuint program)

{
  CallLogWrapper *this_00;
  GLint length;
  GLint status;
  vector<char,_std::allocator<char>_> log;
  allocator_type local_39;
  int local_38;
  int local_34;
  vector<char,_std::allocator<char>_> local_30;
  
  this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b82,&local_34);
  glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b84,&local_38);
  if (1 < (long)local_38) {
    std::vector<char,_std::allocator<char>_>::vector(&local_30,(long)local_38,&local_39);
    glu::CallLogWrapper::glGetProgramInfoLog
              (this_00,program,local_38,(GLsizei *)0x0,
               local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
    anon_unknown_0::Output
              ("%s\n",local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    if (local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (GLchar *)0x0) {
      operator_delete(local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return local_34 == 1;
}

Assistant:

bool CheckProgram(GLuint program)
	{
		GLint status;
		glGetProgramiv(program, GL_LINK_STATUS, &status);
		GLint length;
		glGetProgramiv(program, GL_INFO_LOG_LENGTH, &length);
		if (length > 1)
		{
			std::vector<GLchar> log(length);
			glGetProgramInfoLog(program, length, NULL, &log[0]);
			Output("%s\n", &log[0]);
		}
		return status == GL_TRUE;
	}